

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

CTX_PTR CreateSuccessors(CPpmd7 *p,Bool skip)

{
  int iVar1;
  uint uVar2;
  char local_264;
  CTX_PTR local_260;
  CTX_PTR c1;
  CPpmd_State *s_1;
  UInt32 s0;
  UInt32 cf;
  CPpmd_State *s;
  CPpmd_Void_Ref successor;
  uint numPs;
  CPpmd_State *ps [64];
  CTX_PTR pCStack_30;
  CPpmd_Byte_Ref upBranch;
  CTX_PTR c;
  undefined2 uStack_20;
  undefined2 local_1e;
  undefined1 auStack_1c [2];
  CPpmd_State upState;
  Bool skip_local;
  CPpmd7 *p_local;
  
  pCStack_30 = p->MinContext;
  ps[0x3f]._4_4_ = CONCAT22(p->FoundState->SuccessorHigh,p->FoundState->SuccessorLow);
  if (skip == 0) {
    _successor = p->FoundState;
  }
  s._4_4_ = (uint)(skip == 0);
  _auStack_1c = skip;
  unique0x1000037b = p;
  do {
    if (pCStack_30->Suffix == 0) {
LAB_009b89ab:
      stack0xffffffffffffffde =
           CONCAT31(stack0xffffffffffffffdf,stack0xffffffffffffffe8->Base[ps[0x3f]._4_4_]);
      SetSuccessor((CPpmd_State *)((long)&c + 6),ps[0x3f]._4_4_ + 1);
      if (pCStack_30->NumStats == 1) {
        local_264 = *(undefined1 *)((long)&pCStack_30->SummFreq + 1);
      }
      else {
        for (c1 = (CTX_PTR)(stack0xffffffffffffffe8->Base + pCStack_30->Stats);
            (char)c1->NumStats != c._6_1_; c1 = (CTX_PTR)((long)&c1->Stats + 2)) {
        }
        iVar1 = *(byte *)((long)&c1->NumStats + 1) - 1;
        uVar2 = ((uint)pCStack_30->SummFreq - (uint)pCStack_30->NumStats) - iVar1;
        if (uVar2 < (uint)(iVar1 * 2)) {
          local_264 = (char)(((iVar1 * 2 + uVar2 * 3) - 1) / (uVar2 * 2));
        }
        else {
          local_264 = uVar2 < (uint)(iVar1 * 5);
        }
        local_264 = local_264 + '\x01';
      }
      stack0xffffffffffffffde = CONCAT22(uStack_20,CONCAT11(local_264,c._6_1_));
      do {
        if (s._4_4_ == 0) {
          return pCStack_30;
        }
        if (stack0xffffffffffffffe8->HiUnit == stack0xffffffffffffffe8->LoUnit) {
          if (stack0xffffffffffffffe8->FreeList[0] == 0) {
            local_260 = (CTX_PTR)AllocUnitsRare(stack0xffffffffffffffe8,0);
            if (local_260 == (CTX_PTR)0x0) {
              return (CTX_PTR)0x0;
            }
          }
          else {
            local_260 = (CTX_PTR)RemoveNode(stack0xffffffffffffffe8,0);
          }
        }
        else {
          local_260 = (CTX_PTR)(stack0xffffffffffffffe8->HiUnit + -0xc);
          stack0xffffffffffffffe8->HiUnit = (Byte *)local_260;
        }
        local_260->NumStats = 1;
        *(undefined4 *)&local_260->SummFreq = stack0xffffffffffffffde;
        *(undefined2 *)((long)&local_260->Stats + 2) = local_1e;
        local_260->Suffix = (int)pCStack_30 - (int)stack0xffffffffffffffe8->Base;
        s._4_4_ = s._4_4_ - 1;
        SetSuccessor(*(CPpmd_State **)(&successor + (ulong)s._4_4_ * 2),
                     (int)local_260 - (int)stack0xffffffffffffffe8->Base);
        pCStack_30 = local_260;
      } while( true );
    }
    pCStack_30 = (CTX_PTR)(stack0xffffffffffffffe8->Base + pCStack_30->Suffix);
    if (pCStack_30->NumStats == 1) {
      _s0 = (CPpmd7_Context_Ref *)&pCStack_30->SummFreq;
    }
    else {
      for (_s0 = (CPpmd7_Context_Ref *)(stack0xffffffffffffffe8->Base + pCStack_30->Stats);
          (Byte)*_s0 != stack0xffffffffffffffe8->FoundState->Symbol;
          _s0 = (CPpmd7_Context_Ref *)((long)_s0 + 6)) {
      }
    }
    if (*(CPpmd_State_Ref *)((long)_s0 + 2) != ps[0x3f]._4_4_) {
      pCStack_30 = (CTX_PTR)(stack0xffffffffffffffe8->Base + *(CPpmd_State_Ref *)((long)_s0 + 2));
      if (s._4_4_ == 0) {
        return pCStack_30;
      }
      goto LAB_009b89ab;
    }
    *(CPpmd7_Context_Ref **)(&successor + (ulong)s._4_4_ * 2) = _s0;
    s._4_4_ = s._4_4_ + 1;
  } while( true );
}

Assistant:

static CTX_PTR CreateSuccessors(CPpmd7 *p, Bool skip)
{
  CPpmd_State upState;
  CTX_PTR c = p->MinContext;
  CPpmd_Byte_Ref upBranch = (CPpmd_Byte_Ref)SUCCESSOR(p->FoundState);
  CPpmd_State *ps[PPMD7_MAX_ORDER];
  unsigned numPs = 0;
  
  if (!skip)
    ps[numPs++] = p->FoundState;
  
  while (c->Suffix)
  {
    CPpmd_Void_Ref successor;
    CPpmd_State *s;
    c = SUFFIX(c);
    if (c->NumStats != 1)
    {
      for (s = STATS(c); s->Symbol != p->FoundState->Symbol; s++);
    }
    else
      s = ONE_STATE(c);
    successor = SUCCESSOR(s);
    if (successor != upBranch)
    {
      c = CTX(successor);
      if (numPs == 0)
        return c;
      break;
    }
    ps[numPs++] = s;
  }
  
  upState.Symbol = *(const Byte *)Ppmd7_GetPtr(p, upBranch);
  SetSuccessor(&upState, upBranch + 1);
  
  if (c->NumStats == 1)
    upState.Freq = ONE_STATE(c)->Freq;
  else
  {
    UInt32 cf, s0;
    CPpmd_State *s;
    for (s = STATS(c); s->Symbol != upState.Symbol; s++);
    cf = s->Freq - 1;
    s0 = c->SummFreq - c->NumStats - cf;
    upState.Freq = (Byte)(1 + ((2 * cf <= s0) ? (5 * cf > s0) : ((2 * cf + 3 * s0 - 1) / (2 * s0))));
  }

  while (numPs != 0)
  {
    /* Create Child */
    CTX_PTR c1; /* = AllocContext(p); */
    if (p->HiUnit != p->LoUnit)
      c1 = (CTX_PTR)(p->HiUnit -= UNIT_SIZE);
    else if (p->FreeList[0] != 0)
      c1 = (CTX_PTR)RemoveNode(p, 0);
    else
    {
      c1 = (CTX_PTR)AllocUnitsRare(p, 0);
      if (!c1)
        return NULL;
    }
    c1->NumStats = 1;
    *ONE_STATE(c1) = upState;
    c1->Suffix = REF(c);
    SetSuccessor(ps[--numPs], REF(c1));
    c = c1;
  }
  
  return c;
}